

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int os_remove(lua_State *L)

{
  int iVar1;
  char *__filename;
  char *filename;
  lua_State *L_local;
  
  __filename = luaL_checklstring(L,1,(size_t *)0x0);
  iVar1 = remove(__filename);
  iVar1 = os_pushresult(L,(uint)(iVar1 == 0),__filename);
  return iVar1;
}

Assistant:

static int os_remove(lua_State*L){
const char*filename=luaL_checkstring(L,1);
return os_pushresult(L,remove(filename)==0,filename);
}